

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O2

int arkAdaptPID(ARKodeHAdaptMem hadapt_mem,int k,realtype hcur,realtype ecur,realtype *hnew)

{
  double dVar1;
  ulong uVar2;
  realtype rVar3;
  realtype rVar4;
  realtype rVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double base;
  double dVar8;
  
  dVar1 = hadapt_mem->k2;
  base = hadapt_mem->ehist[0];
  dVar8 = hadapt_mem->ehist[1];
  uVar6 = SUB84(dVar8,0);
  uVar7 = (undefined4)((ulong)dVar8 >> 0x20);
  if (base <= 1e-10) {
    base = 1e-10;
  }
  if (dVar8 <= 1e-10) {
    uVar6 = 0xd9d7bdbb;
    uVar7 = 0x3ddb7cdf;
  }
  if (ecur <= 1e-10) {
    ecur = 1e-10;
  }
  rVar5 = hadapt_mem->k3;
  uVar2 = (ulong)DAT_005fd980;
  dVar8 = (double)k;
  rVar3 = SUNRpowerR(ecur,(double)((ulong)hadapt_mem->k1 ^ uVar2) / dVar8);
  rVar4 = SUNRpowerR(base,dVar1 / dVar8);
  rVar5 = SUNRpowerR((realtype)CONCAT44(uVar7,uVar6),(double)((ulong)rVar5 ^ uVar2) / dVar8);
  *hnew = rVar5 * rVar4 * rVar3 * hcur;
  return 0;
}

Assistant:

int arkAdaptPID(ARKodeHAdaptMem hadapt_mem, int k, realtype hcur,
                realtype ecur, realtype *hnew)
{
  realtype k1, k2, k3, e1, e2, e3, h_acc;

  /* set usable time-step adaptivity parameters */
  k1 = -hadapt_mem->k1 / k;
  k2 =  hadapt_mem->k2 / k;
  k3 = -hadapt_mem->k3 / k;
  e1 = SUNMAX(ecur, TINY);
  e2 = SUNMAX(hadapt_mem->ehist[0], TINY);
  e3 = SUNMAX(hadapt_mem->ehist[1], TINY);

  /* compute estimated optimal time step size, set into output */
  h_acc = hcur * SUNRpowerR(e1,k1) * SUNRpowerR(e2,k2) * SUNRpowerR(e3,k3);
  *hnew = h_acc;

  return(ARK_SUCCESS);
}